

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cpp
# Opt level: O2

void __thiscall type::type(type *this,string *typeName,uint8_t numFields)

{
  allocator_type local_31;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_30;
  
  type(this);
  std::__cxx11::string::_M_assign((string *)this);
  this->numFields = numFields;
  this->cardinality = 0;
  this->primaryKey = '\0';
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_30,(ulong)numFields,&local_31);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(&this->fieldsName,&local_30);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_30);
  return;
}

Assistant:

type::type(std::string &typeName, uint8_t numFields): type() {
    this->typeName = typeName;
    this->numFields = numFields;
    this->cardinality = 0;
    this->primaryKey = 0;
    this->fieldsName = std::vector<std::string>(numFields);
}